

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

bool __thiscall Json::Value::removeIndex(Value *this,ArrayIndex index,Value *removed)

{
  ArrayIndex AVar1;
  iterator iVar2;
  Value *other;
  mapped_type *this_00;
  anon_union_4_2_4572b0f8_for_CZString_1 index_00;
  bool bVar3;
  CZString keyLast;
  CZString key;
  CZString local_a0;
  key_type local_90;
  Value local_80;
  Value local_58;
  
  if (this->field_0x8 == '\x06') {
    local_90.cstr_ = (char *)0x0;
    local_90.field_1.index_ = index;
    iVar2 = std::
            _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
            ::find(&((this->value_).map_)->_M_t,&local_90);
    bVar3 = (_Rb_tree_header *)iVar2._M_node !=
            &(((this->value_).map_)->_M_t)._M_impl.super__Rb_tree_header;
    if (bVar3) {
      Value(&local_58,(Value *)&iVar2._M_node[1]._M_left);
      swap(removed,&local_58);
      ~Value(&local_58);
      AVar1 = size(this);
      local_a0.field_1.index_ = index;
      while (local_a0.field_1.index_ < AVar1 - 1) {
        local_a0.cstr_ = (char *)0x0;
        index_00.index_ = local_a0.field_1.index_ + 1;
        other = operator[](this,index_00.index_);
        Value(&local_80,other);
        this_00 = std::
                  map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                  ::operator[]((this->value_).map_,&local_a0);
        swap(this_00,&local_80);
        ~Value(&local_80);
        CZString::~CZString(&local_a0);
        local_a0.field_1.index_ = index_00.index_;
      }
      local_a0.cstr_ = (char *)0x0;
      local_a0.field_1.index_ = AVar1 - 1;
      iVar2 = std::
              _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
              ::find(&((this->value_).map_)->_M_t,&local_a0);
      std::
      _Rb_tree<Json::Value::CZString,std::pair<Json::Value::CZString_const,Json::Value>,std::_Select1st<std::pair<Json::Value::CZString_const,Json::Value>>,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
      ::erase_abi_cxx11_((_Rb_tree<Json::Value::CZString,std::pair<Json::Value::CZString_const,Json::Value>,std::_Select1st<std::pair<Json::Value::CZString_const,Json::Value>>,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
                          *)(this->value_).map_,iVar2);
      CZString::~CZString(&local_a0);
    }
    CZString::~CZString(&local_90);
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool Value::removeIndex(ArrayIndex index, Value* removed) {
  if (type_ != arrayValue) {
    return false;
  }
  CZString key(index);
  ObjectValues::iterator it = value_.map_->find(key);
  if (it == value_.map_->end()) {
    return false;
  }
  *removed = it->second;
  ArrayIndex oldSize = size();
  // shift left all items left, into the place of the "removed"
  for (ArrayIndex i = index; i < (oldSize - 1); ++i){
    CZString keey(i);
    (*value_.map_)[keey] = (*this)[i + 1];
  }
  // erase the last one ("leftover")
  CZString keyLast(oldSize - 1);
  ObjectValues::iterator itLast = value_.map_->find(keyLast);
  value_.map_->erase(itLast);
  return true;
}